

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O1

void __thiscall QGles2CommandBuffer::resetCommands(QGles2CommandBuffer *this)

{
  QRhiBufferData *this_00;
  undefined8 *puVar1;
  long lVar2;
  
  (this->commands).p = 0;
  std::_Destroy_n_aux<false>::__destroy_n<QByteArray*,long_long>
            ((QByteArray *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr,
             (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s);
  (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s = 0;
  lVar2 = (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s;
  if (0 < lVar2) {
    this_00 = (QRhiBufferData *)
              (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
    lVar2 = lVar2 + 1;
    do {
      QRhiBufferData::~QRhiBufferData(this_00);
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s = 0;
  lVar2 = (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s;
  if (0 < lVar2) {
    puVar1 = (undefined8 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
    lVar2 = lVar2 + 1;
    do {
      (**(code **)*puVar1)(puVar1);
      puVar1 = puVar1 + 3;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s = 0;
  std::_Destroy_n_aux<false>::__destroy_n<QRhiPassResourceTracker*,long_long>
            ((QRhiPassResourceTracker *)
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr,
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s);
  (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s = 0;
  this->currentPassResTrackerIndex = -1;
  return;
}

Assistant:

void resetCommands() {
        commands.reset();
        dataRetainPool.clear();
        bufferDataRetainPool.clear();
        imageRetainPool.clear();

        passResTrackers.clear();
        currentPassResTrackerIndex = -1;
    }